

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

void __thiscall
cfd::core::
JsonObjectVector<cfd::js::api::json::PsbtGlobalXpubInput,_cfd::js::api::PsbtGlobalXpubInputStruct>::
ConvertFromStruct(JsonObjectVector<cfd::js::api::json::PsbtGlobalXpubInput,_cfd::js::api::PsbtGlobalXpubInputStruct>
                  *this,vector<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
                        *list)

{
  bool bVar1;
  undefined1 local_f0 [8];
  PsbtGlobalXpubInput object;
  PsbtGlobalXpubInputStruct *element;
  const_iterator __end0;
  const_iterator __begin0;
  vector<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
  *__range3;
  vector<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
  *list_local;
  JsonObjectVector<cfd::js::api::json::PsbtGlobalXpubInput,_cfd::js::api::PsbtGlobalXpubInputStruct>
  *this_local;
  
  __end0 = std::
           vector<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
           ::begin(list);
  element = (PsbtGlobalXpubInputStruct *)
            std::
            vector<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>
            ::end(list);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_cfd::js::api::PsbtGlobalXpubInputStruct_*,_std::vector<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>_>
                                *)&element);
    if (!bVar1) break;
    object._176_8_ =
         __gnu_cxx::
         __normal_iterator<const_cfd::js::api::PsbtGlobalXpubInputStruct_*,_std::vector<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>_>
         ::operator*(&__end0);
    js::api::json::PsbtGlobalXpubInput::PsbtGlobalXpubInput((PsbtGlobalXpubInput *)local_f0);
    js::api::json::PsbtGlobalXpubInput::ConvertFromStruct
              ((PsbtGlobalXpubInput *)local_f0,(PsbtGlobalXpubInputStruct *)object._176_8_);
    std::
    vector<cfd::js::api::json::PsbtGlobalXpubInput,_std::allocator<cfd::js::api::json::PsbtGlobalXpubInput>_>
    ::push_back(&(this->super_JsonVector<cfd::js::api::json::PsbtGlobalXpubInput>).
                 super_vector<cfd::js::api::json::PsbtGlobalXpubInput,_std::allocator<cfd::js::api::json::PsbtGlobalXpubInput>_>
                ,(value_type *)local_f0);
    js::api::json::PsbtGlobalXpubInput::~PsbtGlobalXpubInput((PsbtGlobalXpubInput *)local_f0);
    __gnu_cxx::
    __normal_iterator<const_cfd::js::api::PsbtGlobalXpubInputStruct_*,_std::vector<cfd::js::api::PsbtGlobalXpubInputStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubInputStruct>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void ConvertFromStruct(const std::vector<STRUCT_TYPE>& list) {
    for (const auto& element : list) {
      TYPE object;
      object.ConvertFromStruct(element);
      std::vector<TYPE>::push_back(object);
    }
  }